

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

void Fra_ClassesSelectRepr(Fra_Cla_t *p)

{
  int iVar1;
  long *plVar2;
  Aig_Obj_t *local_50;
  int local_30;
  int nSuppSizeCur;
  int nSuppSizeMin;
  int cMinSupp;
  int c;
  int i;
  Aig_Obj_t *pNodeMin;
  Aig_Obj_t **pClass;
  Fra_Cla_t *p_local;
  
  for (cMinSupp = 0; iVar1 = Vec_PtrSize(p->vClasses), cMinSupp < iVar1; cMinSupp = cMinSupp + 1) {
    plVar2 = (long *)Vec_PtrEntry(p->vClasses,cMinSupp);
    nSuppSizeCur = -1;
    _c = 0;
    local_30 = 1000000000;
    for (nSuppSizeMin = 0; plVar2[nSuppSizeMin] != 0; nSuppSizeMin = nSuppSizeMin + 1) {
      iVar1 = Aig_SupportSize(p->pAig,(Aig_Obj_t *)plVar2[nSuppSizeMin]);
      if ((iVar1 < local_30) ||
         ((local_30 == iVar1 &&
          (((uint)((ulong)*(undefined8 *)(plVar2[nSuppSizeMin] + 0x18) >> 0x20) & 0xffffff) <
           ((uint)((ulong)*(undefined8 *)(_c + 0x18) >> 0x20) & 0xffffff))))) {
        _c = plVar2[nSuppSizeMin];
        nSuppSizeCur = nSuppSizeMin;
        local_30 = iVar1;
      }
    }
    if (nSuppSizeCur != 0) {
      plVar2[nSuppSizeCur] = *plVar2;
      *plVar2 = _c;
      for (nSuppSizeMin = 0; plVar2[nSuppSizeMin] != 0; nSuppSizeMin = nSuppSizeMin + 1) {
        if (nSuppSizeMin == 0) {
          local_50 = (Aig_Obj_t *)0x0;
        }
        else {
          local_50 = (Aig_Obj_t *)*plVar2;
        }
        Fra_ClassObjSetRepr((Aig_Obj_t *)plVar2[nSuppSizeMin],local_50);
      }
    }
  }
  return;
}

Assistant:

void Fra_ClassesSelectRepr( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass, * pNodeMin;
    int i, c, cMinSupp, nSuppSizeMin, nSuppSizeCur;
    // reassign representatives in each class
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        // collect support sizes and find the min-support node
        cMinSupp = -1;
        pNodeMin = NULL;
        nSuppSizeMin = ABC_INFINITY;
        for ( c = 0; pClass[c]; c++ )
        {
            nSuppSizeCur = Aig_SupportSize( p->pAig, pClass[c] );
//            nSuppSizeCur = 1;
            if ( nSuppSizeMin > nSuppSizeCur || 
                (nSuppSizeMin == nSuppSizeCur && pNodeMin->Level > pClass[c]->Level) )
            {
                nSuppSizeMin = nSuppSizeCur;
                pNodeMin = pClass[c];
                cMinSupp = c; 
            }
        }
        // skip the case when the repr did not change
        if ( cMinSupp == 0 )
            continue;
        // make the new node the representative of the class
        pClass[cMinSupp] = pClass[0];
        pClass[0] = pNodeMin;
        // set the representative
        for ( c = 0; pClass[c]; c++ )
            Fra_ClassObjSetRepr( pClass[c], c? pClass[0] : NULL );
    }
}